

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::CameraHandle::We(CameraHandle *this,Ray *ray,SampledWavelengths *lambda,Point2f *pRaster2)

{
  ulong uVar1;
  SampledSpectrum SVar2;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  if (2 < (ushort)(uVar1 >> 0x30)) {
    if ((uVar1 & 0xfffe000000000000) == 0x2000000000000) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.h"
               ,0x198,"We() unimplemented for SphericalCamera");
    }
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.h"
             ,0x1c9,"We() unimplemented for RealisticCamera");
  }
  if ((uVar1 & 0x3000000000000) != 0x2000000000000) {
    SVar2 = PerspectiveCamera::We
                      ((PerspectiveCamera *)(uVar1 & 0xffffffffffff),ray,
                       (SampledWavelengths *)0x2000000000030,pRaster2);
    return (array<float,_4>)(array<float,_4>)SVar2;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.h"
           ,0x120,"We() unimplemented for OrthographicCamera");
}

Assistant:

SampledSpectrum CameraHandle::We(const Ray &ray, SampledWavelengths &lambda,
                                 Point2f *pRaster2) const {
    auto we = [&](auto ptr) { return ptr->We(ray, lambda, pRaster2); };
    return Dispatch(we);
}